

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetObjectRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Member *members,SizeType count,
            MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Member *members_00;
  Member *m;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_local;
  SizeType count_local;
  Member *members_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  (this->data_).f.flags = 3;
  if (count == 0) {
    SetMembersPointer(this,(Member *)0x0);
  }
  else {
    members_00 = (Member *)
                 MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,(ulong)count << 5);
    SetMembersPointer(this,members_00);
    memcpy(members_00,members,(ulong)count << 5);
  }
  (this->data_).s.hashcode = count;
  (this->data_).s.length = count;
  return;
}

Assistant:

void SetObjectRaw(Member* members, SizeType count, Allocator& allocator) {
        data_.f.flags = kObjectFlag;
        if (count) {
            Member* m = static_cast<Member*>(allocator.Malloc(count * sizeof(Member)));
            SetMembersPointer(m);
            std::memcpy(m, members, count * sizeof(Member));
        }
        else
            SetMembersPointer(0);
        data_.o.size = data_.o.capacity = count;
    }